

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_waveops.cpp
# Opt level: O0

bool dxil_spv::emit_wave_match_instruction(Impl *impl,CallInst *instruction)

{
  bool bVar1;
  TypeID TVar2;
  Id IVar3;
  Id IVar4;
  Builder *pBVar5;
  Value *pVVar6;
  Type *pTVar7;
  Operation *pOVar8;
  Operation *pOVar9;
  Operation *pOVar10;
  int width;
  Operation *is_helper_lane_1;
  Operation *call_op;
  Id call_id;
  Operation *and_op;
  Operation *non_helper_op;
  Operation *not_op;
  Operation *is_helper_lane;
  Operation *op;
  Operation *bitcast_op;
  Id local_28;
  Op cast_op;
  Id value_id;
  Id type_id;
  Builder *builder;
  CallInst *instruction_local;
  Impl *impl_local;
  
  pBVar5 = Converter::Impl::builder(impl);
  pVVar6 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,1);
  pTVar7 = LLVMBC::Value::getType(pVVar6);
  cast_op = Converter::Impl::get_type_id(impl,pTVar7,0);
  pVVar6 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,1);
  local_28 = Converter::Impl::get_id_for_value(impl,pVVar6,0);
  bitcast_op._4_4_ = OpNop;
  pVVar6 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,1);
  pTVar7 = LLVMBC::Value::getType(pVVar6);
  TVar2 = LLVMBC::Type::getTypeID(pTVar7);
  if (TVar2 == HalfTyID) {
    bVar1 = Converter::Impl::support_native_fp16_operations(impl);
    width = 0x20;
    if (bVar1) {
      width = 0x10;
    }
    cast_op = spv::Builder::makeUintType(pBVar5,width);
    bitcast_op._4_4_ = OpBitcast;
  }
  else if (TVar2 == FloatTyID) {
    cast_op = spv::Builder::makeUintType(pBVar5,0x20);
    bitcast_op._4_4_ = OpBitcast;
  }
  else if (TVar2 == DoubleTyID) {
    cast_op = spv::Builder::makeUintType(pBVar5,0x40);
    bitcast_op._4_4_ = OpBitcast;
  }
  if (bitcast_op._4_4_ != OpNop) {
    pOVar8 = Converter::Impl::allocate(impl,bitcast_op._4_4_,cast_op);
    Operation::add_id(pOVar8,local_28);
    local_28 = pOVar8->id;
    Converter::Impl::add(impl,pOVar8,false);
  }
  if (((impl->options).nv_subgroup_partition_enabled & 1U) == 0) {
    IVar3 = SPIRVModule::get_helper_call_id(impl->spirv_module,WaveMatch,cast_op);
    IVar4 = spv::Builder::makeUintType(pBVar5,0x20);
    IVar4 = spv::Builder::makeVectorType(pBVar5,IVar4,4);
    pOVar8 = Converter::Impl::allocate(impl,OpFunctionCall,(Value *)instruction,IVar4);
    Operation::add_id(pOVar8,IVar3);
    Operation::add_id(pOVar8,local_28);
    bVar1 = wave_op_needs_helper_lane_masking(impl);
    if (bVar1) {
      pBVar5 = Converter::Impl::builder(impl);
      IVar3 = spv::Builder::makeBoolType(pBVar5);
      pOVar9 = Converter::Impl::allocate(impl,OpIsHelperInvocationEXT,IVar3);
      Converter::Impl::add(impl,pOVar9,false);
      Operation::add_id(pOVar8,pOVar9->id);
    }
    Converter::Impl::add(impl,pOVar8,false);
  }
  else {
    spv::Builder::addExtension(pBVar5,"SPV_NV_shader_subgroup_partitioned");
    spv::Builder::addCapability(pBVar5,CapabilityGroupNonUniformPartitionedNV);
    IVar3 = spv::Builder::makeUintType(pBVar5,0x20);
    IVar3 = spv::Builder::makeVectorType(pBVar5,IVar3,4);
    pOVar8 = Converter::Impl::allocate(impl,OpGroupNonUniformPartitionNV,(Value *)instruction,IVar3)
    ;
    Operation::add_id(pOVar8,local_28);
    Converter::Impl::add(impl,pOVar8,false);
    bVar1 = wave_op_needs_helper_lane_masking(impl);
    if (bVar1) {
      IVar3 = spv::Builder::makeBoolType(pBVar5);
      pOVar9 = Converter::Impl::allocate(impl,OpIsHelperInvocationEXT,IVar3);
      Converter::Impl::add(impl,pOVar9,false);
      IVar3 = spv::Builder::makeBoolType(pBVar5);
      pOVar10 = Converter::Impl::allocate(impl,OpLogicalNot,IVar3);
      Operation::add_id(pOVar10,pOVar9->id);
      Converter::Impl::add(impl,pOVar10,false);
      IVar3 = spv::Builder::makeUintType(pBVar5,0x20);
      IVar3 = spv::Builder::makeVectorType(pBVar5,IVar3,4);
      pOVar9 = Converter::Impl::allocate(impl,OpGroupNonUniformBallot,IVar3);
      IVar3 = spv::Builder::makeUintConstant(pBVar5,3,false);
      Operation::add_id(pOVar9,IVar3);
      Operation::add_id(pOVar9,pOVar10->id);
      Converter::Impl::add(impl,pOVar9,false);
      spv::Builder::addCapability(pBVar5,CapabilityGroupNonUniformBallot);
      IVar3 = spv::Builder::makeUintType(pBVar5,0x20);
      IVar3 = spv::Builder::makeVectorType(pBVar5,IVar3,4);
      pOVar10 = Converter::Impl::allocate(impl,OpBitwiseAnd,IVar3);
      Operation::add_id(pOVar10,pOVar8->id);
      Operation::add_id(pOVar10,pOVar9->id);
      Converter::Impl::add(impl,pOVar10,false);
      Converter::Impl::rewrite_value(impl,(Value *)instruction,pOVar10->id);
    }
  }
  return true;
}

Assistant:

bool emit_wave_match_instruction(Converter::Impl &impl, const llvm::CallInst *instruction)
{
	auto &builder = impl.builder();
	spv::Id type_id = impl.get_type_id(instruction->getOperand(1)->getType());
	spv::Id value_id = impl.get_id_for_value(instruction->getOperand(1));

	// It's not safe to use FOrdEqual since a loop with NaN will never compare equal to BroadcastFirst().
	// Make sure we compare equal with uint.
	spv::Op cast_op = spv::OpNop;
	switch (instruction->getOperand(1)->getType()->getTypeID())
	{
	case llvm::Type::TypeID::HalfTyID:
		type_id = builder.makeUintType(impl.support_native_fp16_operations() ? 16 : 32);
		cast_op = spv::OpBitcast;
		break;

	case llvm::Type::TypeID::FloatTyID:
		type_id = builder.makeUintType(32);
		cast_op = spv::OpBitcast;
		break;

	case llvm::Type::TypeID::DoubleTyID:
		type_id = builder.makeUintType(64);
		cast_op = spv::OpBitcast;
		break;

	default:
		break;
	}

	if (cast_op != spv::OpNop)
	{
		auto *bitcast_op = impl.allocate(cast_op, type_id);
		bitcast_op->add_id(value_id);
		value_id = bitcast_op->id;
		impl.add(bitcast_op);
	}

	if (impl.options.nv_subgroup_partition_enabled)
	{
		builder.addExtension("SPV_NV_shader_subgroup_partitioned");
		builder.addCapability(spv::CapabilityGroupNonUniformPartitionedNV);
		auto *op = impl.allocate(spv::OpGroupNonUniformPartitionNV, instruction,
		                         builder.makeVectorType(builder.makeUintType(32), 4));
		op->add_id(value_id);
		impl.add(op);

		if (wave_op_needs_helper_lane_masking(impl))
		{
			auto *is_helper_lane = impl.allocate(spv::OpIsHelperInvocationEXT, builder.makeBoolType());
			impl.add(is_helper_lane);

			auto *not_op = impl.allocate(spv::OpLogicalNot, builder.makeBoolType());
			not_op->add_id(is_helper_lane->id);
			impl.add(not_op);

			auto *non_helper_op = impl.allocate(spv::OpGroupNonUniformBallot,
			                                    builder.makeVectorType(builder.makeUintType(32), 4));
			non_helper_op->add_id(builder.makeUintConstant(spv::ScopeSubgroup));
			non_helper_op->add_id(not_op->id);
			impl.add(non_helper_op);
			builder.addCapability(spv::CapabilityGroupNonUniformBallot);

			auto *and_op = impl.allocate(spv::OpBitwiseAnd, builder.makeVectorType(builder.makeUintType(32), 4));
			and_op->add_id(op->id);
			and_op->add_id(non_helper_op->id);
			impl.add(and_op);

			impl.rewrite_value(instruction, and_op->id);
		}
	}
	else
	{
		spv::Id call_id = impl.spirv_module.get_helper_call_id(HelperCall::WaveMatch, type_id);
		auto *call_op =
		    impl.allocate(spv::OpFunctionCall, instruction, builder.makeVectorType(builder.makeUintType(32), 4));
		call_op->add_id(call_id);
		call_op->add_id(value_id);

		if (wave_op_needs_helper_lane_masking(impl))
		{
			auto *is_helper_lane = impl.allocate(spv::OpIsHelperInvocationEXT, impl.builder().makeBoolType());
			impl.add(is_helper_lane);
			call_op->add_id(is_helper_lane->id);
		}

		impl.add(call_op);
	}

	return true;
}